

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchLiteralNode::BuildCharTrie
          (MatchLiteralNode *this,Compiler *compiler,CharTrie *trie,Node *cont,bool isAcceptFirst)

{
  ArenaAllocator *allocator;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ThreadContext *this_00;
  undefined4 *puVar5;
  char16_t **ppcVar6;
  CharTrie *pCVar7;
  CharTrie *newTail;
  CharTrie *pCStack_40;
  CharCount i;
  CharTrie *tail;
  bool isAcceptFirst_local;
  Node *cont_local;
  CharTrie *trie_local;
  Compiler *compiler_local;
  MatchLiteralNode *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,compiler->scriptContext,(PVOID)0x0);
  if ((this->isEquivClass & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x469,"(!isEquivClass)","!isEquivClass");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  newTail._4_4_ = 0;
  pCStack_40 = trie;
  while( true ) {
    if (this->length <= newTail._4_4_) {
      if (cont == (Node *)0x0) {
        iVar3 = CharTrie::Count(pCStack_40);
        if (0 < iVar3) {
          return false;
        }
        CharTrie::SetAccepting(pCStack_40);
      }
      else {
        uVar4 = (*cont->_vptr_Node[0x15])(cont,compiler,pCStack_40,0,(ulong)isAcceptFirst);
        if ((uVar4 & 1) == 0) {
          return false;
        }
      }
      return true;
    }
    bVar2 = CharTrie::IsAccepting(pCStack_40);
    if (bVar2) {
      return isAcceptFirst;
    }
    allocator = compiler->ctAllocator;
    ppcVar6 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                        ((WriteBarrierPtr *)&(compiler->program->rep).insts.litbuf);
    pCVar7 = CharTrie::Add(pCStack_40,allocator,(*ppcVar6)[this->offset + newTail._4_4_]);
    iVar3 = CharTrie::Count(pCStack_40);
    if (0x10 < iVar3) break;
    newTail._4_4_ = newTail._4_4_ + 1;
    pCStack_40 = pCVar7;
  }
  return false;
}

Assistant:

bool MatchLiteralNode::BuildCharTrie(Compiler& compiler, CharTrie* trie, Node* cont, bool isAcceptFirst) const
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(!isEquivClass);
        CharTrie* tail = trie;
        for (CharCount i = 0; i < length; i++)
        {
            if (tail->IsAccepting())
            {
                // An earlier literal is a prefix of this literal
                // If isAcceptFirst, can ignore suffix of already recognized literal.
                // Otherwise, must fail.
                return isAcceptFirst;
            }
            CharTrie* newTail = tail->Add(compiler.ctAllocator, compiler.program->rep.insts.litbuf[offset + i]);
            if (tail->Count() > maxTrieArmExpansion)
                return false;
            tail = newTail;
        }
        if (cont == 0)
        {
            if (tail->Count() > 0)
                // This literal is a proper prefix of an earlier literal
                return false;
            tail->SetAccepting();
        }
        else
        {
            if (!cont->BuildCharTrie(compiler, tail, 0, isAcceptFirst))
                return false;
        }
        return true;
    }